

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O1

void Of_ManComputeForwardDirconCut(Of_Man_t *p,int iObj,int *pCut,int *pDelay1,int *pDelay2)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  int Delays [6];
  int Perm [6];
  int local_7c [7];
  Jf_Par_t *local_60;
  int local_58 [8];
  ulong local_38;
  ulong uVar16;
  
  local_58[0] = 0;
  local_58[1] = 1;
  local_58[2] = 2;
  local_58[3] = 3;
  local_58[4] = 4;
  local_58[5] = 5;
  local_60 = p->pPars;
  iVar1 = local_60->nDelayLut1;
  iVar2 = local_60->nDelayLut2;
  uVar10 = 0;
  uVar15 = *pCut & 0x1f;
  uVar16 = (ulong)uVar15;
  if (uVar15 != 0) {
    do {
      uVar13 = pCut[uVar10 + 1];
      if ((int)uVar13 < 0) goto LAB_006ff08c;
      if (uVar13 < 2) goto LAB_006fedc6;
      local_7c[uVar10 + 1] = p->pObjs[uVar13 >> 1].Delay1 + iVar1;
      uVar10 = uVar10 + 1;
    } while (uVar16 != uVar10);
    uVar10 = (ulong)uVar15;
  }
LAB_006fedc6:
  uVar13 = local_60->nLutSize;
  if ((int)uVar10 < (int)uVar13) {
    uVar10 = uVar10 & 0xffffffff;
    do {
      local_7c[uVar10 + 1] = -1000000000;
      uVar10 = uVar10 + 1;
    } while (uVar13 != uVar10);
  }
  if (1 < uVar15) {
    uVar6 = 1;
    uVar10 = 0;
    do {
      uVar8 = uVar10 & 0xffffffff;
      uVar12 = uVar6;
      do {
        uVar5 = uVar12 & 0xffffffff;
        if (local_7c[uVar12 + 1] <= local_7c[(long)(int)uVar8 + 1]) {
          uVar5 = uVar8;
        }
        uVar8 = uVar5;
        uVar12 = uVar12 + 1;
      } while (uVar16 != uVar12);
      iVar7 = local_58[uVar10];
      lVar14 = (long)(int)uVar8;
      local_58[uVar10] = local_58[lVar14];
      iVar9 = local_7c[uVar10 + 1];
      local_7c[uVar10 + 1] = local_7c[lVar14 + 1];
      uVar10 = uVar10 + 1;
      local_58[lVar14] = iVar7;
      local_7c[lVar14 + 1] = iVar9;
      uVar6 = uVar6 + 1;
    } while (uVar10 != uVar15 - 1);
  }
  if ((1 < uVar15) && (local_7c[1] < local_7c[(ulong)(uVar15 - 1) + 1])) {
    __assert_fail("nSize < 2 || Delays[0] >= Delays[nSize-1]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaOf.c"
                  ,0x52a,"void Of_ManComputeForwardDirconCut(Of_Man_t *, int, int *, int *, int *)")
    ;
  }
  if ((local_7c[1] < 0) || (local_7c[uVar16] < 0)) {
    __assert_fail("Delays[0] >= 0 && Delays[nSize-1] >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaOf.c"
                  ,0x52b,"void Of_ManComputeForwardDirconCut(Of_Man_t *, int, int *, int *, int *)")
    ;
  }
  *pDelay2 = 0;
  local_7c[0] = 0;
  *pDelay1 = 0;
  if (local_60->nFastEdges < (int)uVar15) {
    local_7c[0] = local_7c[(long)local_60->nFastEdges + 1];
  }
  local_38 = uVar16;
  if (uVar15 != 0) {
    bVar4 = true;
    uVar10 = 0;
    do {
      uVar13 = pCut[(long)local_58[uVar10] + 1];
      if ((int)uVar13 < 0) goto LAB_006ff08c;
      uVar11 = uVar13 >> 1;
      iVar7 = local_7c[uVar10 + 1];
      if (iVar7 != p->pObjs[uVar11].Delay1 + iVar1) {
        __assert_fail("Delays[k] == Of_ObjDelay1(p, iVar) + DelayLut1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaOf.c"
                      ,0x539,
                      "void Of_ManComputeForwardDirconCut(Of_Man_t *, int, int *, int *, int *)");
      }
      if (((((long)uVar10 < (long)local_60->nFastEdges) && (local_7c[0] < iVar7)) && (bVar4)) &&
         (iVar9 = p->pObjs[uVar11].Delay2 + iVar2, iVar9 < iVar7)) {
        if (p->pGia->nObjs <= (int)uVar11) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        uVar3 = *(undefined8 *)(p->pGia->pObjs + uVar11);
        uVar11 = (uint)uVar3;
        if (((~uVar11 & 0x1fffffff) == 0 || (int)uVar11 < 0) ||
           ((((uint)((ulong)uVar3 >> 0x20) ^ uVar11) & 0x1fffffff) == 0)) goto LAB_006fef7d;
        uVar13 = uVar13 | 1;
        bVar4 = true;
      }
      else {
LAB_006fef7d:
        uVar13 = uVar13 & 0x7ffffffe;
        bVar4 = false;
        iVar9 = iVar7;
      }
      pCut[(long)local_58[uVar10] + 1] = uVar13;
      if (iVar9 < *pDelay1) {
        iVar9 = *pDelay1;
      }
      *pDelay1 = iVar9;
      if (iVar7 < *pDelay2) {
        iVar7 = *pDelay2;
      }
      *pDelay2 = iVar7;
      uVar10 = uVar10 + 1;
    } while (uVar16 != uVar10);
  }
  if (*pDelay2 < *pDelay1) {
    if (uVar15 != 0) {
      uVar10 = 0;
      do {
        if (pCut[uVar10 + 1] < 0) goto LAB_006ff08c;
        pCut[uVar10 + 1] = pCut[uVar10 + 1] & 0x7ffffffe;
        uVar10 = uVar10 + 1;
      } while (uVar16 != uVar10);
    }
    *pDelay1 = *pDelay2;
  }
  if (*pDelay2 < *pDelay1) {
    __assert_fail("*pDelay1 <= *pDelay2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaOf.c"
                  ,0x552,"void Of_ManComputeForwardDirconCut(Of_Man_t *, int, int *, int *, int *)")
    ;
  }
  uVar15 = *pCut & 0x1f;
  pCut[(ulong)uVar15 + 1] = *pDelay1;
  pCut[(ulong)uVar15 + 2] = *pDelay2;
  if (uVar15 != 0) {
    uVar10 = 0;
    do {
      uVar13 = pCut[uVar10 + 1];
      if ((int)uVar13 < 0) {
LAB_006ff08c:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10c,"int Abc_Lit2Var(int)");
      }
      if (uVar13 < 2) {
        return;
      }
      uVar11 = uVar13 >> 1;
      if ((uVar13 & 1) == 0) {
        if (*pDelay1 < p->pObjs[uVar11].Delay1 + iVar1) {
          __assert_fail("Of_ObjDelay1(p, iVar) + DelayLut1 <= *pDelay1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaOf.c"
                        ,0x55b,
                        "void Of_ManComputeForwardDirconCut(Of_Man_t *, int, int *, int *, int *)");
        }
      }
      else if (*pDelay1 < p->pObjs[uVar11].Delay2 + iVar2) {
        __assert_fail("Of_ObjDelay2(p, iVar) + DelayLut2 <= *pDelay1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaOf.c"
                      ,0x559,
                      "void Of_ManComputeForwardDirconCut(Of_Man_t *, int, int *, int *, int *)");
      }
      if (*pDelay2 < p->pObjs[uVar11].Delay1 + iVar1) {
        __assert_fail("Of_ObjDelay1(p, iVar) + DelayLut1 <= *pDelay2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaOf.c"
                      ,0x55c,
                      "void Of_ManComputeForwardDirconCut(Of_Man_t *, int, int *, int *, int *)");
      }
      uVar10 = uVar10 + 1;
    } while (uVar15 != uVar10);
  }
  return;
}

Assistant:

void Of_ManComputeForwardDirconCut( Of_Man_t * p, int iObj, int * pCut, int * pDelay1, int * pDelay2 )
{
    // Delay1 - main delay;  Delay2 - precomputed LUT delay in terms of Delay1 for the fanins
    int Delays[6], Perm[6] = {0, 1, 2, 3, 4, 5}; 
    int DelayLut1 = p->pPars->nDelayLut1;
    int DelayLut2 = p->pPars->nDelayLut2;
    int nSize = Of_CutSize(pCut);
    int k, iVar, Flag, SlowCon, Delay, DelayAfter, fDirConWorks;
    Of_CutForEachVar( pCut, iVar, k )
    {
        Delays[k] = Of_ObjDelay1(p, iVar) + DelayLut1;
//        printf( "%3d%s ", iVar, Flag ? "*" : " " );
    }
    for ( ; k < p->pPars->nLutSize; k++ )
    {
        Delays[k] = -ABC_INFINITY;
//        printf( "     " );
    }
    Vec_IntSelectSortCost2Reverse( Perm, nSize, Delays );
    assert( nSize < 2 || Delays[0] >= Delays[nSize-1] );
    assert( Delays[0] >= 0 && Delays[nSize-1] >= 0 );
    // consider speedup due to dircons
    fDirConWorks = 1;
    *pDelay1 = *pDelay2 = 0;
    SlowCon = p->pPars->nFastEdges < nSize ? Delays[p->pPars->nFastEdges] : 0;
    for ( k = 0; k < nSize; k++ )
    {
        // use dircon if the following is true
        // - the input is eligible for dircon (does not exceed the limit)
        // - there is an expected gain in delay, compared the largest delay without dircon
        // - the dircon delay is indeed lower than the largest delay without dircon
        // - all previous dircons worked out well
        // - the node is an AND-gate 
        iVar = Of_CutVar( pCut, Perm[k] );
        assert( Delays[k] == Of_ObjDelay1(p, iVar) + DelayLut1 );
        DelayAfter = Of_ObjDelay2(p, iVar) + DelayLut2;
        if ( k < p->pPars->nFastEdges && Delays[k] > SlowCon && DelayAfter < Delays[k] && fDirConWorks && Gia_ObjIsAndNotBuf(Gia_ManObj(p->pGia, iVar)) )
        {
            Delay = DelayAfter;
            Of_CutSetFlag( pCut, Perm[k], 1 );
        }
        else
        {
            Delay = Delays[k];// + DelayLut2;
            Of_CutSetFlag( pCut, Perm[k], 0 );
            fDirConWorks = 0;
        }
        *pDelay1 = Abc_MaxInt( *pDelay1, Delay );
        *pDelay2 = Abc_MaxInt( *pDelay2, Delays[k] );
    }
//    printf( "   %5.2f",   Of_Int2Flt(*pDelay1) );
//    printf( "   %5.2f\n", Of_Int2Flt(*pDelay2) );
    // do not use the structure if simple LUT is better
    if ( *pDelay1 > *pDelay2 )
    {
        for ( k = 0; k < nSize; k++ )
            Of_CutSetFlag( pCut, k, 0 );
        *pDelay1 = *pDelay2;
    }
    assert( *pDelay1 <= *pDelay2 );
    Of_CutSetDelay1( pCut, *pDelay1 );
    Of_CutSetDelay2( pCut, *pDelay2 );
    // verify
    Of_CutForEachVarFlag( pCut, iVar, Flag, k )
    {
        if ( Flag )
            assert( Of_ObjDelay2(p, iVar) + DelayLut2 <= *pDelay1 );
        else
            assert( Of_ObjDelay1(p, iVar) + DelayLut1 <= *pDelay1 );
        assert( Of_ObjDelay1(p, iVar) + DelayLut1 <= *pDelay2 );
    }
}